

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O1

void __thiscall dynamicgraph::Signal<double,_int>::~Signal(Signal<double,_int> *this)

{
  ~Signal(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

virtual ~Signal() {}